

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb.c
# Opt level: O2

int cubeb_init(cubeb **context,char *context_name,char *backend_name)

{
  int iVar1;
  int iVar2;
  code *pcVar3;
  long lVar4;
  _func_int_cubeb_ptr_ptr_char_ptr *default_init [4];
  
  if (backend_name != (char *)0x0) {
    iVar1 = strcmp(backend_name,"pulse");
    if (iVar1 == 0) {
      pcVar3 = pulse_init;
      goto LAB_0011cffb;
    }
    iVar1 = strcmp(backend_name,"pulse-rust");
    if ((iVar1 != 0) && (iVar1 = strcmp(backend_name,"jack"), iVar1 != 0)) {
      iVar1 = strcmp(backend_name,"alsa");
      if (iVar1 == 0) {
        pcVar3 = alsa_init;
        goto LAB_0011cffb;
      }
      iVar1 = strcmp(backend_name,"audiounit");
      if ((((iVar1 != 0) && (iVar1 = strcmp(backend_name,"audiounit-rust"), iVar1 != 0)) &&
          (iVar1 = strcmp(backend_name,"wasapi"), iVar1 != 0)) &&
         ((iVar1 = strcmp(backend_name,"winmm"), iVar1 != 0 &&
          (iVar1 = strcmp(backend_name,"sndio"), iVar1 == 0)))) {
        pcVar3 = sndio_init;
        goto LAB_0011cffb;
      }
    }
  }
  pcVar3 = (_func_int_cubeb_ptr_ptr_char_ptr *)0x0;
LAB_0011cffb:
  default_init[0] = pcVar3;
  default_init[1] = pulse_init;
  default_init[2] = sndio_init;
  default_init[3] = alsa_init;
  if (context == (cubeb **)0x0) {
    iVar1 = -3;
  }
  else {
    iVar1 = -1;
    for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
      if ((default_init[lVar4] != (_func_int_cubeb_ptr_ptr_char_ptr *)0x0) &&
         (iVar2 = (*default_init[lVar4])(context,context_name), iVar2 == 0)) {
        return 0;
      }
    }
  }
  return iVar1;
}

Assistant:

int
cubeb_init(cubeb ** context, char const * context_name, char const * backend_name)
{
  int (* init_oneshot)(cubeb **, char const *) = NULL;

  if (backend_name != NULL) {
    if (!strcmp(backend_name, "pulse")) {
#if defined(USE_PULSE)
      init_oneshot = pulse_init;
#endif
    } else if (!strcmp(backend_name, "pulse-rust")) {
#if defined(USE_PULSE_RUST)
      init_oneshot = pulse_rust_init;
#endif
    } else if (!strcmp(backend_name, "jack")) {
#if defined(USE_JACK)
      init_oneshot = jack_init;
#endif
    } else if (!strcmp(backend_name, "alsa")) {
#if defined(USE_ALSA)
      init_oneshot = alsa_init;
#endif
    } else if (!strcmp(backend_name, "audiounit")) {
#if defined(USE_AUDIOUNIT)
      init_oneshot = audiounit_init;
#endif
    } else if (!strcmp(backend_name, "audiounit-rust")) {
#if defined(USE_AUDIOUNIT_RUST)
      init_oneshot = audiounit_rust_init;
#endif
    } else if (!strcmp(backend_name, "wasapi")) {
#if defined(USE_WASAPI)
      init_oneshot = wasapi_init;
#endif
    } else if (!strcmp(backend_name, "winmm")) {
#if defined(USE_WINMM)
      init_oneshot = winmm_init;
#endif
    } else if (!strcmp(backend_name, "sndio")) {
#if defined(USE_SNDIO)
      init_oneshot = sndio_init;
#endif
    } else if (!strcmp(backend_name, "sun")) {
#if defined(USE_SUN)
      init_oneshot = sun_init;
#endif
    } else if (!strcmp(backend_name, "opensl")) {
#if defined(USE_OPENSL)
      init_oneshot = opensl_init;
#endif
    } else if (!strcmp(backend_name, "oss")) {
#if defined(USE_OSS)
      init_oneshot = oss_init;
#endif
    } else if (!strcmp(backend_name, "aaudio")) {
#if defined(USE_AAUDIO)
      init_oneshot = aaudio_init;
#endif
    } else if (!strcmp(backend_name, "audiotrack")) {
#if defined(USE_AUDIOTRACK)
      init_oneshot = audiotrack_init;
#endif
    } else if (!strcmp(backend_name, "kai")) {
#if defined(USE_KAI)
      init_oneshot = kai_init;
#endif
    } else {
      /* Already set */
    }
  }

  int (* default_init[])(cubeb **, char const *) = {
    /*
     * init_oneshot must be at the top to allow user
     * to override all other choices
     */
    init_oneshot,
#if defined(USE_PULSE_RUST)
    pulse_rust_init,
#endif
#if defined(USE_PULSE)
    pulse_init,
#endif
#if defined(USE_JACK)
    jack_init,
#endif
#if defined(USE_SNDIO)
    sndio_init,
#endif
#if defined(USE_ALSA)
    alsa_init,
#endif
#if defined (USE_OSS)
    oss_init,
#endif
#if defined(USE_AUDIOUNIT_RUST)
    audiounit_rust_init,
#endif
#if defined(USE_AUDIOUNIT)
    audiounit_init,
#endif
#if defined(USE_WASAPI)
    wasapi_init,
#endif
#if defined(USE_WINMM)
    winmm_init,
#endif
#if defined(USE_SUN)
    sun_init,
#endif
#if defined(USE_OPENSL)
    opensl_init,
#endif
    // TODO: should probably be preferred over OpenSLES when available.
    // Initialization will fail on old android devices.
#if defined(USE_AAUDIO)
    aaudio_init,
#endif
#if defined(USE_AUDIOTRACK)
    audiotrack_init,
#endif
#if defined(USE_KAI)
    kai_init,
#endif
  };
  int i;

  if (!context) {
    return CUBEB_ERROR_INVALID_PARAMETER;
  }

#define OK(fn) assert((* context)->ops->fn)
  for (i = 0; i < NELEMS(default_init); ++i) {
    if (default_init[i] && default_init[i](context, context_name) == CUBEB_OK) {
      /* Assert that the minimal API is implemented. */
      OK(get_backend_id);
      OK(destroy);
      OK(stream_init);
      OK(stream_destroy);
      OK(stream_start);
      OK(stream_stop);
      OK(stream_get_position);
      return CUBEB_OK;
    }
  }
  return CUBEB_ERROR;
}